

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O2

int run_test_thread_mutex_recursive(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_40;
  uv_mutex_t mutex;
  
  iVar1 = uv_mutex_init_recursive(&mutex);
  if (iVar1 == 0) {
    uv_mutex_lock(&mutex);
    uv_mutex_lock(&mutex);
    iVar1 = uv_mutex_trylock(&mutex);
    if (iVar1 == 0) {
      uv_mutex_unlock(&mutex);
      uv_mutex_unlock(&mutex);
      uv_mutex_unlock(&mutex);
      uv_mutex_destroy(&mutex);
      return 0;
    }
    pcVar2 = "0 == uv_mutex_trylock(&mutex)";
    uStack_40 = 0x3e;
  }
  else {
    pcVar2 = "r == 0";
    uStack_40 = 0x3a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-mutexes.c"
          ,uStack_40,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(thread_mutex_recursive) {
  uv_mutex_t mutex;
  int r;

  r = uv_mutex_init_recursive(&mutex);
  ASSERT(r == 0);

  uv_mutex_lock(&mutex);
  uv_mutex_lock(&mutex);
  ASSERT(0 == uv_mutex_trylock(&mutex));

  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);

  return 0;
}